

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluator.cpp
# Opt level: O2

list<GCPtr<symbols::Object>,_std::allocator<GCPtr<symbols::Object>_>_> * __thiscall
evaluator::Evaluator::evalProgram_abi_cxx11_
          (list<GCPtr<symbols::Object>,_std::allocator<GCPtr<symbols::Object>_>_>
           *__return_storage_ptr__,Evaluator *this,Program *program,Env *env)

{
  undefined8 *puVar1;
  Object *in_RAX;
  long lVar2;
  undefined8 *puVar3;
  GCPtr<symbols::Object> result;
  GCPtr<symbols::Object> local_38;
  
  (__return_storage_ptr__->
  super__List_base<GCPtr<symbols::Object>,_std::allocator<GCPtr<symbols::Object>_>_>)._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->
  super__List_base<GCPtr<symbols::Object>,_std::allocator<GCPtr<symbols::Object>_>_>)._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->
  super__List_base<GCPtr<symbols::Object>,_std::allocator<GCPtr<symbols::Object>_>_>)._M_impl.
  _M_node._M_size = 0;
  puVar1 = *(undefined8 **)(this + 0x18);
  local_38.addr = in_RAX;
  for (puVar3 = *(undefined8 **)(this + 0x10); puVar3 != puVar1; puVar3 = puVar3 + 1) {
    Eval((Evaluator *)&local_38,(Node *)*puVar3,(Env *)program);
    if (local_38.addr != (Object *)0x0) {
      lVar2 = __dynamic_cast(local_38.addr,&symbols::Object::typeinfo,
                             &symbols::ReturnObject::typeinfo,0);
      if (lVar2 != 0) {
        GCPtr<symbols::Object>::operator=(&local_38,*(Object **)(lVar2 + 0x10));
      }
    }
    std::__cxx11::list<GCPtr<symbols::Object>,_std::allocator<GCPtr<symbols::Object>_>_>::push_back
              (__return_storage_ptr__,&local_38);
    GCPtr<symbols::Object>::~GCPtr(&local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

list<GCPtr<Object>> Evaluator::evalProgram(Program *program, Env* env){
    list<GCPtr<Object>> evaluatedStmts;
    for(auto stmt : program->Stmts){
        auto result = Eval(stmt, env);
        if(auto res = dynamic_cast<ReturnObject*>(result.raw())){
            result =  res->value;
        }
        evaluatedStmts.push_back(result);
    }
    return evaluatedStmts;
}